

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

int CoreVsnprintf(CPalThread *pthrCurrent,LPSTR Buffer,size_t Count,LPCSTR Format,
                 __va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  char *__s;
  bool bVar1;
  FILE *pFVar2;
  long lVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  DWORD DVar7;
  LPSTR lpMultiByteStr;
  LPSTR pCVar8;
  INT *pIVar9;
  byte *pbVar10;
  short *psVar11;
  undefined8 *puVar12;
  size_t sVar13;
  int *piVar14;
  uint *puVar15;
  ulong uVar16;
  WCHAR *pWVar17;
  uint uVar18;
  INT IVar19;
  INT Count_00;
  undefined8 uVar20;
  ulong uVar21;
  long lVar22;
  long in_FS_OFFSET;
  bool bVar23;
  ulong uStack_4b8;
  CHAR TempBuffer [5];
  uint local_4a0;
  int local_49c;
  INT Prefix;
  INT Type;
  LPSTR local_490;
  long local_488;
  WCHAR local_47a;
  LPCSTR pCStack_478;
  WCHAR TempWChar;
  LPCSTR Fmt;
  uint local_468;
  INT Flags;
  INT Precision;
  INT Width;
  undefined1 auStack_458 [8];
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_458._0_4_ = aparg->gp_offset;
  auStack_458._4_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  local_488 = (long)(int)Count;
  local_490 = Buffer + Count;
  Type = -1;
  bVar23 = false;
  lVar22 = local_488;
  pCStack_478 = Format;
  _Precision = Buffer;
LAB_0011a44f:
  do {
    if (*pCStack_478 == '\0') {
      bVar1 = !bVar23;
LAB_0011ac1b:
      if ((long)_Precision - (long)Buffer < lVar22) {
        *_Precision = '\0';
      }
      if (bVar1) {
        Type = Precision - (int)Buffer;
      }
      else {
        piVar14 = __errno_location();
        *piVar14 = 0x22;
      }
LAB_0011ac49:
      if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
        __stack_chk_fail();
      }
      return Type;
    }
    bVar1 = false;
    if ((bVar23) || (bVar1 = false, lVar22 <= (long)(_Precision + -(long)Buffer)))
    goto LAB_0011ac1b;
    if ((*pCStack_478 == '%') &&
       (BVar4 = Internal_ExtractFormatA
                          ((CPalThread *)(_Precision + -(long)Buffer),&stack0xfffffffffffffb88,
                           local_438,(LPINT)((long)&Fmt + 4),&Flags,(LPINT)&local_468,
                           (LPINT)&local_4a0,&local_49c), uVar20 = ap[0]._0_8_, IVar19 = Flags,
       uVar18 = Fmt._4_4_, lVar3 = local_488, iVar5 = local_49c, uVar6 = local_4a0, BVar4 != 0)) {
      if (local_49c == 2 && (local_4a0 ^ 2) == 0) {
        if (Flags == -3) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          IVar19 = -3;
        }
        else if (Flags == -2) {
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (uVar21 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            pIVar9 = (INT *)(uVar21 + (long)ap[0].overflow_arg_area);
          }
          else {
            pIVar9 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          IVar19 = *pIVar9;
          Flags = IVar19;
        }
        uVar21 = (ulong)auStack_458 & 0xffffffff;
        if (local_468 == 0xfffffffc) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            uVar21 = (ulong)(auStack_458._0_4_ + 8);
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            uVar6 = 0xfffffffc;
            goto LAB_0011a6aa;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
          uVar6 = 0xfffffffc;
LAB_0011a6cf:
          puVar12 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
          uVar6 = local_468;
          if (local_468 == 0xfffffffe) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              puVar15 = (uint *)((long)ap[0].overflow_arg_area + uVar21);
              uVar21 = (ulong)(auStack_458._0_4_ + 8);
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
            }
            else {
              puVar15 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar6 = *puVar15;
            local_468 = uVar6;
          }
LAB_0011a6aa:
          if (0x28 < (uint)uVar21) goto LAB_0011a6cf;
          auStack_458._0_4_ = (uint)uVar21 + 8;
          puVar12 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
        }
        lpWideCharStr = (LPCWSTR)*puVar12;
        iVar5 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar5 == 0) {
          uVar20 = 0x663;
LAB_0011acdd:
          fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,uVar20);
          pFVar2 = _stderr;
          DVar7 = GetLastError();
          fprintf(pFVar2,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
          goto LAB_0011ac49;
        }
        lpMultiByteStr = (LPSTR)CorUnix::InternalMalloc((long)iVar5);
        if (lpMultiByteStr == (LPSTR)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) {
            abort();
          }
          piVar14 = __errno_location();
          *piVar14 = 8;
          goto LAB_0011ac49;
        }
        pCVar8 = lpMultiByteStr;
        uVar18 = 0;
        Prefix = IVar19;
        if (uVar6 != 0xfffffffd) {
          uVar18 = iVar5 - 1;
          if (((int)uVar6 < 1) || ((int)uVar18 <= (int)uVar6)) {
            iVar5 = WideCharToMultiByte(0,0,lpWideCharStr,-1,lpMultiByteStr,iVar5,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar5 != 0) goto LAB_0011a795;
            uVar20 = 0x68d;
          }
          else {
            iVar5 = WideCharToMultiByte(0,0,lpWideCharStr,uVar6,lpMultiByteStr,iVar5,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar5 != 0) {
              pCVar8 = lpMultiByteStr + iVar5;
              uVar18 = uVar6;
              goto LAB_0011a76c;
            }
            uVar20 = 0x67d;
          }
          fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,uVar20);
          pFVar2 = _stderr;
          DVar7 = GetLastError();
          fprintf(pFVar2,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
          CorUnix::InternalFree(lpMultiByteStr);
          goto LAB_0011ac49;
        }
LAB_0011a76c:
        *pCVar8 = '\0';
LAB_0011a795:
        BVar4 = Internal_AddPaddingA
                          ((LPSTR *)&Precision,(int)local_490 - Precision,lpMultiByteStr,
                           Prefix - uVar18,Fmt._4_4_);
        bVar23 = BVar4 == 0;
        CorUnix::InternalFree(lpMultiByteStr);
        lVar22 = local_488;
      }
      else {
        if ((local_4a0 ^ 2) == 0 && local_49c == 1) {
          uVar6 = auStack_458._0_4_;
          if (Flags + 3U < 2) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              uVar6 = auStack_458._0_4_;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          if ((local_468 & 0xfffffffd) == 0xfffffffc) {
            if (uVar6 < 0x29) {
              uVar6 = uVar6 + 8;
              auStack_458._0_4_ = uVar6;
              goto LAB_0011a81a;
            }
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0011a8b0:
            pWVar17 = (WCHAR *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          else {
LAB_0011a81a:
            if (0x28 < uVar6) goto LAB_0011a8b0;
            auStack_458._0_4_ = uVar6 + 8;
            pWVar17 = (WCHAR *)((ulong)uVar6 + (long)ap[0].overflow_arg_area);
          }
          local_47a = *pWVar17;
          iVar5 = WideCharToMultiByte(0,0,&local_47a,1,(LPSTR)&uStack_4b8,5,(LPCSTR)0x0,(LPBOOL)0x0)
          ;
          if (iVar5 != 0) {
            TempBuffer[(long)iVar5 + -8] = '\0';
            Count_00 = (int)local_490 - Precision;
            IVar19 = IVar19 - iVar5;
            goto LAB_0011a92d;
          }
          uVar20 = 0x6b6;
          goto LAB_0011acdd;
        }
        if (local_49c == 6) {
          if (Flags == -2) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              pIVar9 = (INT *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar9 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Flags = *pIVar9;
          }
          if (local_468 == 0xfffffffe) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              puVar15 = (uint *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar15 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_468 = *puVar15;
          }
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (local_4a0 == 1) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              puVar12 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar12 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(short *)*puVar12 = (short)((long)_Precision - (long)Buffer);
          }
          else {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              puVar12 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar12 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(int *)*puVar12 = (int)((long)_Precision - (long)Buffer);
          }
          goto LAB_0011a548;
        }
        if (local_49c == 1) {
          if ((Fmt._4_4_ & 4) == 0) goto LAB_0011a850;
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (uVar21 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            pbVar10 = (byte *)(uVar21 + (long)ap[0].overflow_arg_area);
          }
          else {
            pbVar10 = (byte *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uStack_4b8._0_2_ = (ushort)*pbVar10;
          Count_00 = (int)local_490 - Precision;
          IVar19 = Flags + -1;
          lVar22 = local_488;
LAB_0011a92d:
          BVar4 = Internal_AddPaddingA
                            ((LPSTR *)&Precision,Count_00,(LPSTR)&uStack_4b8,IVar19,Fmt._4_4_);
          bVar23 = BVar4 == 0;
        }
        else if ((local_49c == 2) && ((Fmt._4_4_ & 4) != 0)) {
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (uVar21 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar12 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar12 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          __s = (char *)*puVar12;
          sVar13 = strlen(__s);
          BVar4 = Internal_AddPaddingA
                            ((LPSTR *)&Precision,(int)local_490 - Precision,__s,Flags - (int)sVar13,
                             uVar18);
          bVar23 = BVar4 == 0;
          lVar22 = lVar3;
        }
        else {
LAB_0011a850:
          uVar21 = (long)local_490 - (long)_Precision;
          if (0x3fffffff < uVar21) {
            uVar21 = 0x40000000;
          }
          if (local_49c == 5 && (local_4a0 ^ 1) == 0) {
            uVar16 = (ulong)auStack_458 & 0xffffffff;
            if (uVar16 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              psVar11 = (short *)(uVar16 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar11 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar18 = snprintf(_Precision,uVar21,local_438,(long)*psVar11);
          }
          else if ((local_4a0 ^ 1) == 0 && local_49c == 4) {
            uVar16 = (ulong)auStack_458 & 0xffffffff;
            if (uVar16 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              psVar11 = (short *)(uVar16 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar11 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar18 = snprintf(_Precision,uVar21,local_438,(ulong)(uint)(int)*psVar11);
          }
          else {
            uStack_4b8 = (ulong)auStack_458;
            TempBuffer[0] = (undefined1)ap[0].gp_offset;
            TempBuffer[1] = ap[0].gp_offset._1_1_;
            TempBuffer[2] = ap[0].gp_offset._2_1_;
            TempBuffer[3] = ap[0].gp_offset._3_1_;
            stack0xfffffffffffffb54 = ap[0].fp_offset;
            ap[0]._0_8_ = uVar20;
            uVar18 = vsnprintf(_Precision,uVar21,local_438,&uStack_4b8);
            PAL_printf_arg_remover((va_list *)auStack_458,Flags,local_468,iVar5,uVar6);
          }
          if (((int)uVar18 < 0) || (uVar21 <= uVar18)) {
            bVar23 = true;
          }
          else {
            bVar23 = false;
            uVar21 = (ulong)uVar18;
          }
          _Precision = _Precision + uVar21;
          lVar22 = local_488;
        }
      }
      goto LAB_0011a44f;
    }
    *_Precision = *pCStack_478;
    pCStack_478 = pCStack_478 + 1;
    _Precision = _Precision + 1;
LAB_0011a548:
    bVar23 = false;
  } while( true );
}

Assistant:

int CoreVsnprintf(CPalThread *pthrCurrent, LPSTR Buffer, size_t Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            else
            {
                // Types that sprintf can handle
                size_t TempCount = Count - (BufferPtr - Buffer);

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short) trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}